

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_msg.h
# Opt level: O2

void __thiscall spdlog::details::log_msg::log_msg(log_msg *this,string *loggers_name,level_enum lvl)

{
  rep rVar1;
  size_t sVar2;
  
  this->logger_name = loggers_name;
  this->level = lvl;
  (this->time).__d.__r = 0;
  (this->raw).super_BasicWriter<char>.buffer_ = &(this->raw).buffer_.super_Buffer<char>;
  (this->raw).super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_001bb000;
  (this->raw).buffer_.super_Buffer<char>.ptr_ = (this->raw).buffer_.data_;
  (this->raw).buffer_.super_Buffer<char>.size_ = 0;
  (this->raw).buffer_.super_Buffer<char>.capacity_ = 500;
  (this->raw).buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_001bb048;
  (this->formatted).super_BasicWriter<char>.buffer_ = &(this->formatted).buffer_.super_Buffer<char>;
  (this->formatted).super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_001bb000;
  (this->formatted).buffer_.super_Buffer<char>.ptr_ = (this->formatted).buffer_.data_;
  (this->formatted).buffer_.super_Buffer<char>.size_ = 0;
  (this->formatted).buffer_.super_Buffer<char>.capacity_ = 500;
  (this->formatted).buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_001bb048;
  this->msg_id = 0;
  this->color_range_start = 0;
  this->color_range_end = 0;
  rVar1 = std::chrono::_V2::system_clock::now();
  (this->time).__d.__r = rVar1;
  sVar2 = os::thread_id();
  this->thread_id = sVar2;
  return;
}

Assistant:

log_msg(const std::string *loggers_name, level::level_enum lvl)
        : logger_name(loggers_name)
        , level(lvl)
    {
#ifndef SPDLOG_NO_DATETIME
        time = os::now();
#endif

#ifndef SPDLOG_NO_THREAD_ID
        thread_id = os::thread_id();
#endif
    }